

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_wrapper.h
# Opt level: O0

void __thiscall
date::iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::iterator_proxy
          (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this,
          istreambuf_iterator<char,_std::char_traits<char>_> *srcIt,
          istreambuf_iterator<char,_std::char_traits<char>_> *srcEnd,value_type *cache,
          size_t *cacheSize)

{
  value_type *pvVar1;
  bool bVar2;
  char_type cVar3;
  size_t sVar4;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> local_40;
  size_t *local_30;
  size_t *cacheSize_local;
  value_type *cache_local;
  istreambuf_iterator<char,_std::char_traits<char>_> *srcEnd_local;
  istreambuf_iterator<char,_std::char_traits<char>_> *srcIt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this_local;
  
  this->m_srcIt = srcIt;
  this->m_srcEnd = srcEnd;
  this->m_cache = cache;
  this->m_cacheSize = cacheSize;
  local_30 = cacheSize;
  cacheSize_local = (size_t *)cache;
  cache_local = (value_type *)srcEnd;
  srcEnd_local = srcIt;
  srcIt_local = (istreambuf_iterator<char,_std::char_traits<char>_> *)this;
  bVar2 = std::operator==(srcIt,srcEnd);
  sVar4 = 0;
  if (bVar2) {
    sVar4 = 0xffffffffffffffff;
  }
  this->m_position = sVar4;
  if (this->m_position != 0xffffffffffffffff) {
    iVar5 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++(srcEnd_local,0);
    local_40._M_sbuf = iVar5._M_sbuf;
    local_40._M_c = iVar5._M_c;
    cVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*(&local_40);
    pvVar1 = this->m_cache;
    sVar4 = *this->m_cacheSize;
    *this->m_cacheSize = sVar4 + 1;
    pvVar1[sVar4] = cVar3;
  }
  return;
}

Assistant:

iterator_proxy(Iterator& srcIt, const Iterator& srcEnd, value_type* cache, std::size_t& cacheSize)
        : m_srcIt(srcIt)
        , m_srcEnd(srcEnd)
        , m_cache(cache)
        , m_cacheSize(cacheSize)
        , m_position((srcIt == srcEnd) ? static_cast<std::size_t>(-1) : 0)
    {
        if (m_position != static_cast<std::size_t>(-1))
            m_cache[m_cacheSize++] = *(srcIt++);
    }